

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

var __thiscall cs::runtime_type::get_string_literal(runtime_type *this,string *data,string *literal)

{
  size_t sVar1;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_cs::callable>_>
  __args;
  runtime_error *this_00;
  key_arg<std::__cxx11::basic_string<char>_> *in_RCX;
  initializer_list<cs_impl::any> __l;
  allocator_type local_49;
  any local_48;
  vector arg;
  
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::callable>>>
          ::count<std::__cxx11::string>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::callable>>>
                      *)data,in_RCX);
  if (sVar1 != 0) {
    cs_impl::any::any<std::__cxx11::string>(&local_48,literal);
    __l._M_len = 1;
    __l._M_array = &local_48;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&arg,__l,&local_49);
    cs_impl::any::recycle(&local_48);
    __args = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::callable>>>
             ::
             at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::callable>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::callable>>>
                         *)data,in_RCX);
    std::function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
    operator()((function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                *)this,(vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)__args);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&arg);
    return (var)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&arg,"Undefined String Literal.",(allocator *)&local_48);
  runtime_error::runtime_error(this_00,(string *)&arg);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var get_string_literal(const std::string &data, const std::string &literal)
		{
			if (literals.count(literal) > 0) {
				vector arg{data};
				return literals.at(literal).call(arg);
			}
			else
				throw runtime_error("Undefined String Literal.");
		}